

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFillAreaStyleTiles::IfcFillAreaStyleTiles(IfcFillAreaStyleTiles *this)

{
  IfcFillAreaStyleTiles *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcFillAreaStyleTiles");
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__00fd78a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFillAreaStyleTiles,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFillAreaStyleTiles,_3UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__00fd78e8);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfd7810;
  *(undefined8 *)&this->field_0x58 = 0xfd7888;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfd7838;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfd7860;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcOneDirectionRepeatFactor>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcOneDirectionRepeatFactor> *)
             &(this->super_IfcGeometricRepresentationItem).field_0x30,(LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>::ListOf(&this->Tiles);
  return;
}

Assistant:

IfcFillAreaStyleTiles() : Object("IfcFillAreaStyleTiles") {}